

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
__thiscall
duckdb::StringValueScanner::GetCSVScanner
          (StringValueScanner *this,ClientContext *context,CSVReaderOptions *options,
          MultiFileOptions *file_options)

{
  idx_t iVar1;
  undefined8 this_00;
  bool bVar2;
  CSVStateMachine *pCVar3;
  idx_t iVar4;
  pointer pSVar5;
  CSVFileScan *this_01;
  ulong rows_to_skip;
  shared_ptr<duckdb::CSVStateMachine,_true> state_machine;
  templated_unique_single_t *scanner;
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  CSVIterator it;
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __uniq_ptr_data<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true,_true>
  local_98;
  uint local_8c;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [4];
  
  local_c0._16_8_ = this;
  local_98.
  super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
  .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
       (__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
        )(__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
          )file_options;
  CSVStateMachineCache::Get(context);
  make_shared_ptr<duckdb::CSVStateMachine,duckdb::CSVReaderOptions&,duckdb::CSVStateMachineOptions&,duckdb::CSVStateMachineCache&>
            ((CSVReaderOptions *)local_d0,(CSVStateMachineOptions *)options,
             (CSVStateMachineCache *)options);
  iVar1 = (options->dialect_options).num_cols;
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     ((shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0);
  (pCVar3->dialect_options).num_cols = iVar1;
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     ((shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0);
  (pCVar3->dialect_options).header = (options->dialect_options).header;
  local_78[0]._M_allocated_capacity._0_4_ = 0;
  make_shared_ptr<duckdb::CSVBufferManager,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,int>
            ((ClientContext *)(local_c0 + 0x18),(CSVReaderOptions *)context,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options,
             (int *)&options->file_path);
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     ((shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0);
  iVar4 = CSVReaderOptions::GetSkipRows(pCVar3->options);
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     ((shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0);
  bVar2 = CSVReaderOptions::GetHeader(pCVar3->options);
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     ((shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0);
  iVar1 = (pCVar3->dialect_options).rows_until_header;
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     ((shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0);
  rows_to_skip = iVar1 + (pCVar3->dialect_options).header.value;
  if (rows_to_skip < iVar4 + bVar2) {
    rows_to_skip = iVar4 + bVar2;
  }
  ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 0x18)
            );
  BaseScanner::SkipCSVRows
            ((CSVIterator *)local_78,(shared_ptr<duckdb::CSVBufferManager,_true> *)&local_88,
             (shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0,rows_to_skip);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  make_shared_ptr<duckdb::CSVErrorHandler>();
  this_00 = local_c0._16_8_;
  local_8c = 0x800;
  make_uniq<duckdb::StringValueScanner,duckdb::shared_ptr<duckdb::CSVBufferManager,true>&,duckdb::shared_ptr<duckdb::CSVStateMachine,true>&,duckdb::shared_ptr<duckdb::CSVErrorHandler,true>,unsigned_int,duckdb::CSVIterator&>
            ((duckdb *)local_c0._16_8_,
             (shared_ptr<duckdb::CSVBufferManager,_true> *)(local_c0 + 0x18),
             (shared_ptr<duckdb::CSVStateMachine,_true> *)local_d0,
             (shared_ptr<duckdb::CSVErrorHandler,_true> *)local_c0,&local_8c,(CSVIterator *)local_78
            );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  make_shared_ptr<duckdb::CSVFileScan,duckdb::ClientContext&,std::__cxx11::string&,duckdb::CSVReaderOptions&,duckdb::MultiFileOptions_const&>
            ((ClientContext *)local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context,
             (CSVReaderOptions *)&options->file_path,(MultiFileOptions *)options);
  pSVar5 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                         *)this_00);
  shared_ptr<duckdb::CSVFileScan,_true>::operator=
            (&(pSVar5->super_BaseScanner).csv_file_scan,
             (shared_ptr<duckdb::CSVFileScan,_true> *)local_c0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  pSVar5 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                         *)this_00);
  this_01 = shared_ptr<duckdb::CSVFileScan,_true>::operator->
                      (&(pSVar5->super_BaseScanner).csv_file_scan);
  CSVFileScan::InitializeProjection(this_01);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  return (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
         (_Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
          )this_00;
}

Assistant:

unique_ptr<StringValueScanner> StringValueScanner::GetCSVScanner(ClientContext &context, CSVReaderOptions &options,
                                                                 const MultiFileOptions &file_options) {
	auto state_machine = make_shared_ptr<CSVStateMachine>(options, options.dialect_options.state_machine_options,
	                                                      CSVStateMachineCache::Get(context));

	state_machine->dialect_options.num_cols = options.dialect_options.num_cols;
	state_machine->dialect_options.header = options.dialect_options.header;
	auto buffer_manager = make_shared_ptr<CSVBufferManager>(context, options, options.file_path, 0);
	idx_t rows_to_skip = state_machine->options.GetSkipRows() + state_machine->options.GetHeader();
	rows_to_skip = std::max(rows_to_skip, state_machine->dialect_options.rows_until_header +
	                                          state_machine->dialect_options.header.GetValue());
	auto it = BaseScanner::SkipCSVRows(buffer_manager, state_machine, rows_to_skip);
	auto scanner = make_uniq<StringValueScanner>(buffer_manager, state_machine, make_shared_ptr<CSVErrorHandler>(),
	                                             STANDARD_VECTOR_SIZE, it);
	scanner->csv_file_scan = make_shared_ptr<CSVFileScan>(context, options.file_path, options, file_options);
	scanner->csv_file_scan->InitializeProjection();
	return scanner;
}